

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall cs222::Parser::parseLabel(Parser *this,string *token,string *label)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar1;
  undefined4 extraout_EAX;
  long *plVar2;
  undefined4 extraout_var;
  pointer psVar3;
  undefined1 local_68 [40];
  long *local_40 [2];
  long local_30 [2];
  
  __s._M_current = (token->_M_dataplus)._M_p;
  local_68._16_8_ = (pointer)0x0;
  local_68._24_8_ = (char *)0x0;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  bVar1 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + token->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_68,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)label_regex_abi_cxx11_,
                     0);
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
  }
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)label);
    return;
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"illegal symbol name: ","");
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_40,(ulong)(token->_M_dataplus)._M_p);
  local_68._0_8_ = *plVar2;
  psVar3 = (pointer)(plVar2 + 2);
  if ((pointer)local_68._0_8_ == psVar3) {
    local_68._16_8_ =
         (psVar3->
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).first._M_current;
    local_68._24_8_ = plVar2[3];
    local_68._0_8_ = (pointer)(local_68 + 0x10);
  }
  else {
    local_68._16_8_ =
         (psVar3->
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).first._M_current;
  }
  local_68._8_8_ = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  throwError(this,(string *)local_68);
  if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  _Unwind_Resume(CONCAT44(extraout_var,extraout_EAX));
}

Assistant:

void Parser::parseLabel(const std::string& token, std::string& label) const
    {
        if (std::regex_match(token, label_regex))
        {
            label = token;
        }
        else
        {
            throwError(std::string("illegal symbol name: ") + token);
        }
    }